

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O2

int Gia_MiniAigSuperMerge(Vec_Int_t *p,int nPis)

{
  int iVar1;
  int Entry;
  int i;
  int iVar2;
  undefined8 local_38;
  
  Entry = -1;
  i = 0;
  iVar2 = 0;
  local_38 = (ulong)(uint)nPis << 0x20;
  while( true ) {
    iVar1 = p->nSize;
    if (iVar1 <= iVar2) break;
    iVar1 = Vec_IntEntry(p,iVar2);
    if (Entry == iVar1) {
      Vec_IntWriteEntry(p,i,Entry % local_38._4_4_ + (Entry / local_38._4_4_ + 1) * local_38._4_4_);
      local_38 = CONCAT44(local_38._4_4_,1);
      i = i + 1;
      iVar1 = -1;
    }
    else if (Entry != -1) {
      Vec_IntWriteEntry(p,i,Entry);
      i = i + 1;
    }
    Entry = iVar1;
    iVar2 = iVar2 + 1;
  }
  iVar2 = i;
  if (Entry != -1) {
    iVar2 = i + 1;
    Vec_IntWriteEntry(p,i,Entry);
    iVar1 = p->nSize;
  }
  if (iVar2 <= iVar1) {
    p->nSize = iVar2;
    return (int)local_38;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

int Gia_MiniAigSuperMerge( Vec_Int_t * p, int nPis )
{
    int i, k = 0, This, Prev = -1, fChange = 0;
    Vec_IntForEachEntry( p, This, i )
    {
        if ( Prev == This )
        {
            Vec_IntWriteEntry( p, k++, (This/nPis+1)*nPis + This%nPis );
            Prev = -1;
            fChange = 1;
        }
        else 
        {
            if ( Prev != -1 ) 
                Vec_IntWriteEntry( p, k++, Prev );
            Prev = This;
        }
    }
    if ( Prev != -1 )
        Vec_IntWriteEntry( p, k++, Prev );
    Vec_IntShrink( p, k );
    return fChange;
}